

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O3

void ctemplate::TemplateDictionary::
     HashInsert<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>,4,std::equal_to<unsigned_long>,ctemplate::small_map_default_init<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>>>,ctemplate::TemplateString>
               (small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::small_map_default_init<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>_>_>
                *m,TemplateString key,TemplateString value)

{
  TemplateId id;
  _Base_ptr p_Var1;
  pair<ctemplate::small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::small_map_default_init<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>_>_>::iterator,_bool>
  local_60;
  value_type local_48;
  
  id = TemplateString::GetGlobalId(&key);
  local_48.second.ptr_ = value.ptr_;
  local_48.second.length_ = value.length_;
  local_48.second.is_immutable_ = value.is_immutable_;
  local_48.second._17_7_ = value._17_7_;
  local_48.second.id_ = value.id_;
  local_48.first = id;
  small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::small_map_default_init<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>_>_>
  ::insert(&local_60,m,&local_48);
  if (local_60.second == false) {
    p_Var1 = local_60.first.hash_iter_._M_node + 1;
    if ((_Base_ptr)local_60.first.array_iter_ != (_Base_ptr)0x0) {
      p_Var1 = (_Base_ptr)local_60.first.array_iter_;
    }
    p_Var1->_M_right = (_Base_ptr)value._16_8_;
    *(TemplateId *)(p_Var1 + 1) = value.id_;
    p_Var1->_M_parent = (_Base_ptr)value.ptr_;
    p_Var1->_M_left = (_Base_ptr)value.length_;
  }
  AddToIdToNameMap(id,&key);
  return;
}

Assistant:

void TemplateDictionary::HashInsert(MapType* m,
                                    TemplateString key, ValueType value) {
  const TemplateId id = key.GetGlobalId();
  DoHashInsert(m, id, value);
  AddToIdToNameMap(id, key);  // allows us to do the hash-key -> name mapping
}